

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactnns.h
# Opt level: O2

void __thiscall
ExactNNS<float,_KBalls<float>_>::ExactNNS
          (ExactNNS<float,_KBalls<float>_> *this,Matrix<float> *data,Matrix<float> *query,
          function<float_(const_float_*,_const_float_*,_unsigned_long)> *cluster_dist,
          size_t num_codebook,size_t clusterK,int topK,size_t max_iteration)

{
  function<float_(const_float_*,_const_float_*,_unsigned_long)> local_50;
  
  this->_vptr_ExactNNS = (_func_int **)&PTR_probeOneBucket_0011dc68;
  std::function<float_(const_float_*,_const_float_*,_unsigned_long)>::function
            (&local_50,cluster_dist);
  ProductQuantization<float,_KBalls<float>_>::ProductQuantization
            (&this->pq,data,query,&local_50,num_codebook,clusterK,max_iteration);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  this->data_ = data;
  this->query_ = query;
  std::ofstream::ofstream(&this->upper_bound_log_,"logs/log_upper_bound_.log",_S_out);
  std::ofstream::ofstream(&this->lower_bound_log_,"logs/log_lower_bound_.log",_S_out);
  std::ofstream::ofstream(&this->percent_log_,"logs/log_percent_.log",_S_out);
  (this->maxHeaps_).
  super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maxHeaps_).
  super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->maxHeaps_).
  super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->topK_ = topK;
  search(this);
  writeResult(this);
  return;
}

Assistant:

ExactNNS(lshbox::Matrix<DataType>& data,
             lshbox::Matrix<DataType>& query,
             std::function< DataType (const DataType*, const DataType*, size_t) > cluster_dist,
             size_t num_codebook, size_t clusterK, int topK, size_t max_iteration)
            : pq(data, query, cluster_dist, num_codebook, clusterK, max_iteration),
              data_(data),
              query_(query),
              topK_(topK),
              upper_bound_log_("logs/log_upper_bound_.log"),
              lower_bound_log_("logs/log_lower_bound_.log"),
              percent_log_("logs/log_percent_.log") {

        //query
        search();
        // write result
        writeResult();
    }